

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluPixelTransfer.cpp
# Opt level: O3

void glu::texSubImage2D(RenderContext *context,deUint32 target,int level,int x,int y,
                       ConstPixelBufferAccess *src)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  TransferFormat TVar7;
  InternalError *this;
  uint uVar8;
  uint uVar9;
  TextureFormat local_38;
  
  iVar4 = (*context->_vptr_RenderContext[3])();
  if ((src->m_size).m_data[2] == 1) {
    iVar1 = (src->m_pitch).m_data[1];
    iVar5 = tcu::TextureFormat::getPixelSize(&src->m_format);
    iVar2 = (src->m_size).m_data[0];
    if (iVar1 == iVar5 * iVar2) {
      iVar1 = (src->m_size).m_data[1];
      TVar7 = getTransferFormat(src->m_format);
      pcVar3 = *(code **)(CONCAT44(extraout_var,iVar4) + 0xff0);
      local_38 = src->m_format;
      uVar6 = tcu::TextureFormat::getPixelSize(&local_38);
      uVar8 = 8;
      if ((int)uVar6 < 8) {
        uVar8 = uVar6;
      }
      uVar9 = 1;
      if ((uVar6 & uVar6 - 1) == 0) {
        uVar9 = uVar8;
      }
      (*pcVar3)(0xcf5,uVar9);
      (**(code **)(CONCAT44(extraout_var,iVar4) + 0x13b8))
                (target,level,x,y,iVar2,iVar1,TVar7,(ulong)TVar7 >> 0x20,src->m_data);
      return;
    }
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,(char *)0x0,"src.getRowPitch() == src.getFormat().getPixelSize()*src.getWidth()"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluPixelTransfer.cpp"
               ,0x70);
  }
  else {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,(char *)0x0,"src.getDepth() == 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluPixelTransfer.cpp"
               ,0x6f);
  }
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void texSubImage2D (const RenderContext& context, deUint32 target, int level, int x, int y, const tcu::ConstPixelBufferAccess& src)
{
	const glw::Functions& gl = context.getFunctions();

	TCU_CHECK_INTERNAL(src.getDepth() == 1);
	TCU_CHECK_INTERNAL(src.getRowPitch() == src.getFormat().getPixelSize()*src.getWidth());

	int				width		= src.getWidth();
	int				height		= src.getHeight();
	TransferFormat	format		= getTransferFormat(src.getFormat());

	gl.pixelStorei(GL_UNPACK_ALIGNMENT, getTransferAlignment(src.getFormat()));
	gl.texSubImage2D(target, level, x, y, width, height, format.format, format.dataType, src.getDataPtr());
}